

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::operator+(RangeValue *this,RangeValue *other)

{
  bool bVar1;
  undefined8 extraout_RAX;
  size_t other_00;
  RangeValue RVar2;
  RangeValue RVar3;
  RangeValue *other_local;
  RangeValue *this_local;
  size_t local_10;
  
  bVar1 = isUnbound(other);
  if (bVar1) {
    RangeValue((RangeValue *)&this_local);
    RVar2._val = local_10;
    RVar2._0_8_ = extraout_RAX;
  }
  else {
    other_00 = value(other);
    RVar2 = operator+(this,other_00);
    this_local._0_1_ = RVar2._isUnbound;
  }
  local_10 = RVar2._val;
  RVar3._1_7_ = RVar2._1_7_;
  RVar3._isUnbound = (bool)this_local._0_1_;
  RVar3._val = local_10;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator+ (const RangeValue& other) const {
    if (other.isUnbound())
        return RangeValue();
    else
        return (*this)+other.value();
}